

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall kj::Vector<char32_t>::setCapacity(Vector<char32_t> *this,size_t newSize)

{
  char32_t *pcVar1;
  ArrayBuilder<char32_t> newBuilder;
  ArrayBuilder<char32_t> local_30;
  
  pcVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pcVar1 >> 2)) {
    (this->builder).pos = pcVar1 + newSize;
  }
  local_30.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<char32_t>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<char32_t>::addAll<kj::ArrayBuilder<char32_t>>(&local_30,&this->builder);
  ArrayBuilder<char32_t>::operator=(&this->builder,&local_30);
  ArrayBuilder<char32_t>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }